

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::argument_incorrect_type::argument_incorrect_type(argument_incorrect_type *this,string *arg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *arg_local;
  argument_incorrect_type *this_local;
  
  local_18 = arg;
  arg_local = (string *)this;
  std::operator+(&local_58,anon_var_dwarf_36b1b,arg);
  std::operator+(&local_38,&local_58,anon_var_dwarf_36b28);
  OptionParseException::OptionParseException(&this->super_OptionParseException,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  *(undefined ***)&(this->super_OptionParseException).super_OptionException =
       &PTR__argument_incorrect_type_001e4b10;
  return;
}

Assistant:

argument_incorrect_type
    (
      const std::string& arg
    )
    : OptionParseException(
      u8"Argument ‘" + arg + u8"’ failed to parse"
    )
    {
    }